

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMFData.cpp
# Opt level: O0

bool checkQuotes(string *str)

{
  bool bVar1;
  reference pcVar2;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  int count;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20 [2];
  int local_c;
  
  local_c = 0;
  local_20[0]._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_20);
    in_stack_ffffffffffffffd7 = *pcVar2;
    if (in_stack_ffffffffffffffd7 == '\"') {
      local_c = local_c + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_20);
  }
  return local_c % 2 == 0;
}

Assistant:

static bool
checkQuotes(const std::string& str)
{
  int count = 0;
  for (char c : str) {
    if (c == '"') {
      count++;
    }
  }
  return (count % 2) == 0;
}